

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void ZSTD_DCtx_resetParameters(ZSTD_DCtx *dctx)

{
  long in_RDI;
  
  if (*(int *)(in_RDI + 0x7618) == 0) {
    *(undefined4 *)(in_RDI + 0x7598) = 0;
    *(undefined8 *)(in_RDI + 0x7638) = 0x8000001;
    *(undefined4 *)(in_RDI + 0x7670) = 0;
    *(undefined4 *)(in_RDI + 0x759c) = 0;
    *(undefined4 *)(in_RDI + 0x7610) = 0;
    *(undefined4 *)(in_RDI + 0x7614) = 0;
    return;
  }
  __assert_fail("dctx->streamStage == zdss_init",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                ,0x9c3c,"void ZSTD_DCtx_resetParameters(ZSTD_DCtx *)");
}

Assistant:

static void ZSTD_DCtx_resetParameters(ZSTD_DCtx* dctx)
{
    assert(dctx->streamStage == zdss_init);
    dctx->format = ZSTD_f_zstd1;
    dctx->maxWindowSize = ZSTD_MAXWINDOWSIZE_DEFAULT;
    dctx->outBufferMode = ZSTD_bm_buffered;
    dctx->forceIgnoreChecksum = ZSTD_d_validateChecksum;
    dctx->refMultipleDDicts = ZSTD_rmd_refSingleDDict;
    dctx->disableHufAsm = 0;
}